

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O1

void __thiscall
tsl::detail_robin_hash::
robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::rehash_impl(robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *this,size_type count_)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  uint uVar6;
  pointer pbVar7;
  undefined8 uVar8;
  size_t sVar9;
  pointer pbVar10;
  size_type sVar11;
  size_type sVar12;
  power_of_two_growth_policy<2UL> pVar13;
  unsigned_long __tmp_3;
  ulong uVar14;
  SelectorEqual *in_RCX;
  ulong uVar15;
  short __tmp_1;
  SelectorHash *in_RDX;
  ushort uVar16;
  bucket_entry *pbVar17;
  allocator<objc_selector_*> *in_R8;
  objc_selector *__tmp;
  unsigned_long __tmp_2;
  bucket_entry<objc_selector_*,_true> *bucket;
  pointer pbVar18;
  robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  new_table;
  robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  local_80;
  
  robin_hash(&local_80,count_,in_RDX,in_RCX,in_R8,this->m_min_load_factor,this->m_max_load_factor);
  pVar13.m_mask = local_80.super_power_of_two_growth_policy<2UL>.m_mask;
  pbVar18 = (this->m_buckets_data).
            super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (this->m_buckets_data).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
joined_r0x0011eb29:
  if (pbVar18 == pbVar7) {
    local_80.m_nb_elements = this->m_nb_elements;
    sVar9 = (this->super_power_of_two_growth_policy<2UL>).m_mask;
    (this->super_power_of_two_growth_policy<2UL>).m_mask =
         local_80.super_power_of_two_growth_policy<2UL>.m_mask;
    pbVar18 = (this->m_buckets_data).
              super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar7 = (this->m_buckets_data).
             super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar10 = (this->m_buckets_data).
              super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_buckets_data).
    super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_80.m_buckets_data.
         super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->m_buckets_data).
    super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_80.m_buckets_data.
         super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_buckets_data).
    super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_80.m_buckets_data.
         super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar17 = this->m_buckets;
    this->m_buckets = local_80.m_buckets;
    sVar11 = this->m_bucket_count;
    this->m_bucket_count = local_80.m_bucket_count;
    sVar12 = this->m_load_threshold;
    this->m_load_threshold = local_80.m_load_threshold;
    fVar1 = this->m_min_load_factor;
    this->m_min_load_factor = local_80.m_min_load_factor;
    fVar2 = this->m_max_load_factor;
    this->m_max_load_factor = local_80.m_max_load_factor;
    bVar3 = this->m_grow_on_next_insert;
    this->m_grow_on_next_insert = local_80.m_grow_on_next_insert;
    bVar4 = this->m_try_shrink_on_next_insert;
    this->m_try_shrink_on_next_insert = local_80.m_try_shrink_on_next_insert;
    local_80.super_power_of_two_growth_policy<2UL>.m_mask = sVar9;
    local_80.m_buckets_data.
    super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar18;
    local_80.m_buckets_data.
    super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar7;
    local_80.m_buckets_data.
    super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar10;
    local_80.m_buckets = pbVar17;
    local_80.m_bucket_count = sVar11;
    local_80.m_load_threshold = sVar12;
    local_80.m_min_load_factor = fVar1;
    local_80.m_max_load_factor = fVar2;
    local_80.m_grow_on_next_insert = bVar3;
    local_80.m_try_shrink_on_next_insert = bVar4;
    std::
    vector<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ::~vector(&local_80.m_buckets_data);
    return;
  }
  if (pbVar18->m_dist_from_ideal_bucket != -1) {
    if (local_80.m_bucket_count < 0x100000001) {
      uVar14 = (ulong)(pbVar18->super_bucket_entry_hash<true>).m_hash;
    }
    else {
      uVar14 = robin_hash<objc_selector*,tsl::robin_set<objc_selector*,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::hash_key<objc_selector*>
                         ((robin_hash<objc_selector*,tsl::robin_set<objc_selector*,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)pbVar18->m_value,(objc_selector **)count_);
    }
    uVar16 = 0;
    uVar15 = uVar14;
    do {
      uVar15 = uVar15 & pVar13.m_mask;
      uVar5 = local_80.m_buckets[uVar15].m_dist_from_ideal_bucket;
      count_ = (size_type)uVar5;
      if ((short)uVar5 < (short)uVar16) {
        pbVar17 = local_80.m_buckets + uVar15;
        uVar8 = *(undefined8 *)pbVar18->m_value;
        if (uVar5 == 0xffff) goto LAB_0011eba8;
        *(undefined8 *)pbVar18->m_value = *(undefined8 *)pbVar17->m_value;
        *(undefined8 *)pbVar17->m_value = uVar8;
        pbVar17->m_dist_from_ideal_bucket = uVar16;
        uVar6 = (pbVar17->super_bucket_entry_hash<true>).m_hash;
        (pbVar17->super_bucket_entry_hash<true>).m_hash = (truncated_hash_type)uVar14;
        uVar14 = (ulong)uVar6;
        uVar16 = uVar5;
      }
      uVar16 = uVar16 + 1;
      uVar15 = uVar15 + 1;
    } while( true );
  }
  goto LAB_0011ebb2;
LAB_0011eba8:
  *(undefined8 *)pbVar17->m_value = uVar8;
  (pbVar17->super_bucket_entry_hash<true>).m_hash = (truncated_hash_type)uVar14;
  pbVar17->m_dist_from_ideal_bucket = uVar16;
LAB_0011ebb2:
  pbVar18 = pbVar18 + 1;
  goto joined_r0x0011eb29;
}

Assistant:

void rehash_impl(size_type count_) {
    robin_hash new_table(count_, static_cast<Hash&>(*this),
                         static_cast<KeyEqual&>(*this), get_allocator(),
                         m_min_load_factor, m_max_load_factor);
    tsl_rh_assert(size() <= new_table.m_load_threshold);

    const bool use_stored_hash =
        USE_STORED_HASH_ON_REHASH(new_table.bucket_count());
    for (auto& bucket : m_buckets_data) {
      if (bucket.empty()) {
        continue;
      }

      const std::size_t hash =
          use_stored_hash ? bucket.truncated_hash()
                          : new_table.hash_key(KeySelect()(bucket.value()));

      new_table.insert_value_on_rehash(new_table.bucket_for_hash(hash), 0,
                                       bucket_entry::truncate_hash(hash),
                                       std::move(bucket.value()));
    }

    new_table.m_nb_elements = m_nb_elements;
    new_table.swap(*this);
  }